

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<double>_>::PrintGlobal
          (TPZFrontNonSym<std::complex<double>_> *this,char *name,ostream *out)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  poVar3 = std::operator<<(out,name);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar6 = 0; lVar6 < (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
      lVar6 = lVar6 + 1) {
    if ((this->super_TPZFront<std::complex<double>_>).fLocal.fStore[lVar6] != -1) {
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::operator<<(poVar3," ");
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  for (lVar6 = 0; lVar4 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements,
      lVar6 < lVar4; lVar6 = lVar6 + 1) {
    if ((this->super_TPZFront<std::complex<double>_>).fLocal.fStore[lVar6] != -1) {
      for (lVar5 = 0; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        plVar1 = (this->super_TPZFront<std::complex<double>_>).fLocal.fStore;
        lVar2 = plVar1[lVar5];
        if (lVar2 != -1) {
          poVar3 = std::operator<<(out,(complex *)
                                       ((this->super_TPZFront<std::complex<double>_>).fData.fStore +
                                       lVar2 * (this->super_TPZFront<std::complex<double>_>).
                                               fMaxFront + plVar1[lVar6]));
          std::operator<<(poVar3," ");
          lVar4 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
        }
      }
      std::endl<char,std::char_traits<char>>(out);
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
	out.flush();
}